

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junction.cpp
# Opt level: O2

void __thiscall Junction::findFullDemand(Junction *this,double multiplier,double patternFactor)

{
  double dVar1;
  _List_node_base *p_Var2;
  undefined1 auStack_58 [8];
  Demand demand;
  
  (this->super_Node).fullDemand = 0.0;
  p_Var2 = (_List_node_base *)&this->demands;
  while (p_Var2 = (((_List_base<Demand,_std::allocator<Demand>_> *)&p_Var2->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)&this->demands
        ) {
    demand.fullDemand = *(double *)(p_Var2 + 1 + 1);
    auStack_58 = (undefined1  [8])p_Var2[1]._M_next;
    demand.baseDemand = (double)p_Var2[1]._M_prev;
    dVar1 = Demand::getFullDemand((Demand *)auStack_58,multiplier,patternFactor);
    (this->super_Node).fullDemand = dVar1 + (this->super_Node).fullDemand;
    Demand::~Demand((Demand *)auStack_58);
  }
  (this->super_Node).actualDemand = (this->super_Node).fullDemand;
  return;
}

Assistant:

void Junction::findFullDemand(double multiplier, double patternFactor)
{
    fullDemand = 0.0;
    for (Demand demand : demands)
    {
        fullDemand += demand.getFullDemand(multiplier, patternFactor);
    }
    actualDemand = fullDemand;
}